

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicRectMatrix.hpp
# Opt level: O3

void __thiscall
OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
          (DynamicRectMatrix<double> *this,uint nrow,uint ncol)

{
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  ulong uVar4;
  
  allocate(this,nrow,ncol);
  uVar1 = this->nrow_;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->ncol_;
    ppdVar3 = this->data_;
    uVar4 = 0;
    do {
      if (uVar2 != 0) {
        memset(ppdVar3[uVar4],0,(ulong)uVar2 << 3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return;
}

Assistant:

DynamicRectMatrix(unsigned int nrow, unsigned int ncol) {
      allocate(nrow, ncol);

      for (unsigned int i = 0; i < nrow_; i++)
        for (unsigned int j = 0; j < ncol_; j++)
          this->data_[i][j] = 0.0;
    }